

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  char *pcVar1;
  unsigned_long uVar2;
  uint64 uVar3;
  uint64 uVar4;
  char *s_00;
  uint64 uVar5;
  long lVar6;
  ulong in_RSI;
  long in_RDI;
  size_t tail_done;
  uint64 z;
  uint64 y;
  uint64 x;
  pair<unsigned_long,_unsigned_long> w;
  pair<unsigned_long,_unsigned_long> v;
  char *in_stack_ffffffffffffff00;
  uint64 local_e0;
  unsigned_long local_d8 [2];
  char *in_stack_ffffffffffffff40;
  ulong uVar7;
  uint128 in_stack_ffffffffffffff48;
  pair<unsigned_long,_unsigned_long> local_a8;
  pair<unsigned_long,_unsigned_long> local_98;
  pair<unsigned_long,_unsigned_long> local_88;
  uint64 local_78;
  char *local_70;
  uint64 local_68;
  pair<unsigned_long,_unsigned_long> local_60;
  pair<unsigned_long,_unsigned_long> local_50 [2];
  ulong local_30;
  long local_28;
  uint128 local_20;
  uint128 local_10;
  
  if (in_RSI < 0x80) {
    local_10 = CityMurmur(in_stack_ffffffffffffff40,local_d8[2],in_stack_ffffffffffffff48);
  }
  else {
    local_30 = in_RSI;
    local_28 = in_RDI;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>(local_50);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>(&local_60);
    local_68 = Uint128Low64(&local_20);
    local_70 = (char *)Uint128High64(&local_20);
    local_78 = local_30 * -0x4b6d499041670d8d;
    uVar3 = Rotate((ulong)local_70 ^ 0xb492b66fbe98f273,0x31);
    uVar3 = uVar3 * -0x4b6d499041670d8d;
    local_50[0].first = Fetch64((char *)0x25376a);
    local_50[0].first = uVar3 + local_50[0].first;
    uVar4 = Rotate(local_50[0].first,0x2a);
    s_00 = (char *)(uVar4 * -0x4b6d499041670d8d);
    uVar4 = Fetch64((char *)0x2537b3);
    local_50[0].second = (unsigned_long)(s_00 + uVar4);
    uVar5 = Rotate((long)local_70 + local_78,0x23);
    uVar4 = local_68;
    local_60.first = uVar5 * -0x4b6d499041670d8d + local_68;
    uVar5 = Fetch64((char *)0x25381c);
    uVar4 = Rotate(uVar4 + uVar5,0x35);
    local_60.second = uVar4 * -0x4b6d499041670d8d;
    do {
      lVar6 = local_68 + (long)local_70 + local_50[0].first;
      uVar4 = Fetch64((char *)0x253871);
      local_68 = Rotate(lVar6 + uVar4,0x25);
      uVar2 = local_50[0].second;
      pcVar1 = local_70;
      local_68 = local_68 * -0x4b6d499041670d8d;
      uVar4 = Fetch64((char *)0x2538be);
      uVar4 = Rotate((uint64)(uVar2 + uVar4 + (long)pcVar1),0x2a);
      local_68 = local_60.second ^ local_68;
      local_70 = (char *)(local_50[0].first ^ uVar4 * -0x4b6d499041670d8d);
      local_78 = Rotate(local_78 ^ local_60.first,0x21);
      local_88 = WeakHashLen32WithSeeds(s_00,uVar3,(uint64)in_stack_ffffffffffffff00);
      std::pair<unsigned_long,_unsigned_long>::operator=(local_50,&local_88);
      local_98 = WeakHashLen32WithSeeds(s_00,uVar3,(uint64)in_stack_ffffffffffffff00);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_60,&local_98);
      std::swap<unsigned_long>(&local_78,&local_68);
      local_28 = local_28 + 0x40;
      uVar4 = local_68 + (long)local_70 + local_50[0].first;
      uVar5 = Fetch64((char *)0x253a32);
      local_68 = Rotate(uVar4 + uVar5,0x25);
      local_68 = local_68 * -0x4b6d499041670d8d;
      in_stack_ffffffffffffff00 = (char *)(local_50[0].second + (long)local_70);
      uVar5 = Fetch64((char *)0x253a80);
      uVar5 = Rotate((uint64)(in_stack_ffffffffffffff00 + uVar5),0x2a);
      local_68 = local_60.second ^ local_68;
      local_70 = (char *)(local_50[0].first ^ uVar5 * -0x4b6d499041670d8d);
      local_78 = Rotate(local_78 ^ local_60.first,0x21);
      local_a8 = WeakHashLen32WithSeeds(s_00,uVar3,(uint64)in_stack_ffffffffffffff00);
      std::pair<unsigned_long,_unsigned_long>::operator=(local_50,&local_a8);
      WeakHashLen32WithSeeds(s_00,uVar3,(uint64)in_stack_ffffffffffffff00);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_60,(type)&stack0xffffffffffffff48);
      std::swap<unsigned_long>(&local_78,&local_68);
      local_28 = local_28 + 0x40;
      local_30 = local_30 - 0x80;
    } while (0x7f < local_30);
    uVar5 = Rotate(local_60.first,0x25);
    local_70 = (char *)(uVar5 * -0x3c5a37a36834ced9 + local_78 + (long)local_70);
    uVar5 = Rotate(local_50[0].first + local_78,0x31);
    local_68 = uVar5 * -0x3c5a37a36834ced9 + local_68;
    uVar7 = 0;
    while (uVar7 < local_30) {
      uVar7 = uVar7 + 0x20;
      uVar5 = Rotate((long)local_70 - local_68,0x2a);
      local_70 = (char *)(local_50[0].second + uVar5 * -0x3c5a37a36834ced9);
      uVar5 = Fetch64((char *)0x253cda);
      local_60.first = uVar5 + local_60.first;
      uVar5 = Rotate(local_68,0x31);
      local_68 = uVar5 * -0x3c5a37a36834ced9 + local_60.first;
      local_60.first = local_50[0].first + local_60.first;
      join_0x00000010_0x00000000_ =
           WeakHashLen32WithSeeds(s_00,uVar3,(uint64)in_stack_ffffffffffffff00);
      std::pair<unsigned_long,_unsigned_long>::operator=(local_50,(type)(local_d8 + 1));
    }
    local_68 = HashLen16((uint64)in_stack_ffffffffffffff00,uVar4);
    local_70 = (char *)HashLen16((uint64)in_stack_ffffffffffffff00,uVar4);
    uVar3 = HashLen16((uint64)in_stack_ffffffffffffff00,uVar4);
    local_d8[0] = uVar3 + (long)local_70;
    local_e0 = HashLen16((uint64)in_stack_ffffffffffffff00,uVar4);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_10,local_d8,&local_e0);
  }
  return local_10;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 16), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y ^= v.first;
    z = Rotate(z ^ w.first, 33);
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y);
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 16), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y ^= v.first;
    z = Rotate(z ^ w.first, 33);
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y);
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  y += Rotate(w.first, 37) * k0 + z;
  x += Rotate(v.first + z, 49) * k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(y - x, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = Rotate(x, 49) * k0 + w.first;
    w.first += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first, v.second);
  }
  // At this point our 48 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 48-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}